

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH32_hash_t VELOCYPACK_XXH32(void *input,size_t len,XXH32_hash_t seed)

{
  xxh_u32 xVar1;
  int *in_RCX;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  if (len < 0x10) {
    iVar4 = seed + 0x165667b1;
  }
  else {
    in_RCX = (int *)((long)input + (len - 0xf));
    iVar4 = seed + 0x24234428;
    uVar3 = seed + 0x85ebca77;
    uVar2 = seed + 0x61c8864f;
    do {
      uVar5 = *input * -0x7a143589 + iVar4;
      uVar6 = uVar5 * 0x2000 | uVar5 >> 0x13;
      uVar3 = *(int *)((long)input + 4) * -0x7a143589 + uVar3;
      uVar8 = uVar3 * 0x2000 | uVar3 >> 0x13;
      iVar4 = uVar6 * -0x61c8864f;
      uVar3 = *(int *)((long)input + 8) * -0x7a143589 + seed;
      uVar7 = uVar3 * 0x2000 | uVar3 >> 0x13;
      uVar3 = uVar8 * -0x61c8864f;
      uVar2 = *(int *)((long)input + 0xc) * -0x7a143589 + uVar2;
      uVar5 = uVar2 * 0x2000 | uVar2 >> 0x13;
      seed = uVar7 * -0x61c8864f;
      uVar2 = uVar5 * -0x61c8864f;
      input = (void *)((long)input + 0x10);
    } while (input < in_RCX);
    iVar4 = (uVar5 * -0x193c0000 | uVar2 >> 0xe) + (uVar7 * 0x779b1000 | seed >> 0x14) +
            (uVar8 * 0x1bbcd880 | uVar3 >> 0x19) + (uVar6 * 0x3c6ef362 | (uint)(iVar4 < 0));
  }
  xVar1 = XXH32_finalize(iVar4 + (uint)len,(xxh_u8 *)input,(ulong)((uint)len & 0xf),
                         (XXH_alignment)in_RCX);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32(const void* input, size_t len,
                                  XXH32_hash_t seed) {
#if 0
    /* Simple version, good for code maintenance, but unfortunately slow for small inputs */
    XXH32_state_t state;
    XXH32_reset(&state, seed);
    XXH32_update(&state, (const xxh_u8*)input, len);
    return XXH32_digest(&state);
#else
  if (XXH_FORCE_ALIGN_CHECK) {
    if ((((size_t)input) & 3) ==
        0) { /* Input is 4-bytes aligned, leverage the speed benefit */
      return XXH32_endian_align((const xxh_u8*)input, len, seed, XXH_aligned);
    }
  }

  return XXH32_endian_align((const xxh_u8*)input, len, seed, XXH_unaligned);
#endif
}